

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_mf.cc
# Opt level: O2

void end_pass(gdmf *d)

{
  vw *all;
  bool bVar1;
  string sStack_58;
  string local_38;
  
  all = d->all;
  all->eta = all->eta_decay_rate * all->eta;
  if (all->save_per_pass == true) {
    std::__cxx11::string::string((string *)&local_38,(string *)&all->final_regressor_name);
    save_predictor(all,&local_38,all->current_pass);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (all->holdout_set_off == false) {
    bVar1 = summarize_holdout_set(all,&d->no_win_counter);
    if (bVar1) {
      std::__cxx11::string::string((string *)&sStack_58,(string *)&all->final_regressor_name);
      finalize_regressor(all,&sStack_58);
      std::__cxx11::string::~string((string *)&sStack_58);
    }
    if ((d->early_stop_thres == d->no_win_counter) &&
       ((all->check_holdout_every_n_passes < 2 ||
        (all->current_pass % all->check_holdout_every_n_passes == 0)))) {
      set_done(all);
    }
  }
  return;
}

Assistant:

void end_pass(gdmf& d)
{
  vw* all = d.all;

  all->eta *= all->eta_decay_rate;
  if (all->save_per_pass)
    save_predictor(*all, all->final_regressor_name, all->current_pass);

  if (!all->holdout_set_off)
  {
    if (summarize_holdout_set(*all, d.no_win_counter))
      finalize_regressor(*all, all->final_regressor_name);
    if ((d.early_stop_thres == d.no_win_counter) &&
        ((all->check_holdout_every_n_passes <= 1) || ((all->current_pass % all->check_holdout_every_n_passes) == 0)))
      set_done(*all);
  }
}